

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basewindow_x11.cc
# Opt level: O1

void __thiscall
bgui::PaintBufferFct::PaintBufferFct
          (PaintBufferFct *this,BaseWindowData *_p,ImageAdapterBase *_im,int _x,int _y)

{
  XImage *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  
  (this->super_ParallelFunction)._vptr_ParallelFunction = (_func_int **)&PTR_run_00163348;
  this->p = _p;
  this->im = _im;
  this->x = _x;
  this->y = _y;
  pXVar1 = _p->image;
  uVar6 = 0xfffffffe;
  do {
    uVar4 = uVar6 + 2;
    uVar6 = uVar6 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar1->red_mask) == 0);
  do {
    uVar6 = uVar6 + 1;
    if (0x1f < uVar6) break;
  } while (((long)(1 << ((byte)uVar6 & 0x1f)) & pXVar1->red_mask) != 0);
  iVar5 = 0;
  if (0x1f < uVar6) {
    uVar6 = 0;
  }
  if (uVar6 < 8) {
    this->rls = 0;
    iVar5 = 8 - uVar6;
  }
  else {
    this->rls = uVar6 - 8;
  }
  this->rrs = iVar5;
  uVar6 = 0xfffffffe;
  do {
    uVar4 = uVar6 + 2;
    uVar6 = uVar6 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar1->green_mask) == 0);
  do {
    uVar6 = uVar6 + 1;
    if (0x1f < uVar6) break;
  } while (((long)(1 << ((byte)uVar6 & 0x1f)) & pXVar1->green_mask) != 0);
  iVar5 = 0;
  if (0x1f < uVar6) {
    uVar6 = 0;
  }
  if (uVar6 < 8) {
    this->gls = 0;
    iVar5 = 8 - uVar6;
  }
  else {
    this->gls = uVar6 - 8;
  }
  this->grs = iVar5;
  uVar6 = 0xfffffffe;
  do {
    uVar4 = uVar6 + 2;
    uVar6 = uVar6 + 1;
    if (0x1f < uVar4) break;
  } while (((long)(1 << ((byte)uVar4 & 0x1f)) & pXVar1->blue_mask) == 0);
  do {
    uVar6 = uVar6 + 1;
    if (0x1f < uVar6) break;
  } while (((long)(1 << ((byte)uVar6 & 0x1f)) & pXVar1->blue_mask) != 0);
  uVar4 = 0;
  if (0x1f < uVar6) {
    uVar6 = uVar4;
  }
  if (uVar6 < 8) {
    this->bls = 0;
    uVar4 = 8 - uVar6;
  }
  else {
    this->bls = uVar6 - 8;
  }
  this->brs = uVar4;
  iVar5 = pXVar1->width;
  iVar2 = (*_im->_vptr_ImageAdapterBase[0xb])(_im);
  lVar3 = CONCAT44(extraout_var,iVar2) + (long)_x;
  if (iVar5 <= lVar3) {
    lVar3 = (long)iVar5;
  }
  this->w = (int)lVar3;
  return;
}

Assistant:

PaintBufferFct(BaseWindowData *_p, const ImageAdapterBase &_im, int _x, int _y) :
      p(_p), im(_im), x(_x), y(_y)
    {
      // store image in buffer

      getShiftFromMask(p->image->red_mask, rls, rrs);
      getShiftFromMask(p->image->green_mask, gls, grs);
      getShiftFromMask(p->image->blue_mask, bls, brs);

      w=std::min(static_cast<long>(p->image->width), x+im.getWidth());
    }